

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O0

int nn_tcp_optset_setopt(nn_optset *self,int option,void *optval,size_t optvallen)

{
  bool local_49;
  nn_optset *local_48;
  int val;
  nn_tcp_optset *optset;
  size_t optvallen_local;
  void *optval_local;
  int option_local;
  nn_optset *self_local;
  
  local_48 = self;
  if (self == (nn_optset *)0x0) {
    local_48 = (nn_optset *)0x0;
  }
  if (optvallen == 4) {
    if (option == 1) {
      local_49 = *optval < 2;
      if (local_49) {
        *(uint *)&local_48[1].vfptr = *optval;
        self_local._4_4_ = 0;
      }
      else {
        self_local._4_4_ = -0x16;
      }
    }
    else {
      self_local._4_4_ = -0x5c;
    }
  }
  else {
    self_local._4_4_ = -0x16;
  }
  return self_local._4_4_;
}

Assistant:

static int nn_tcp_optset_setopt (struct nn_optset *self, int option,
    const void *optval, size_t optvallen)
{
    struct nn_tcp_optset *optset;
    int val;

    optset = nn_cont (self, struct nn_tcp_optset, base);

    /*  At this point we assume that all options are of type int. */
    if (optvallen != sizeof (int))
        return -EINVAL;
    val = *(int*) optval;

    switch (option) {
    case NN_TCP_NODELAY:
        if (nn_slow (val != 0 && val != 1))
            return -EINVAL;
        optset->nodelay = val;
        return 0;
    default:
        return -ENOPROTOOPT;
    }
}